

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

int getopt_long(int argc,char **argv,char *optstring,option *longopts,int *longindex)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  option *poVar6;
  char *__s1;
  int iVar7;
  option *poVar8;
  
  iVar7 = optind;
  optarg = (char *)0x0;
  optopt = 0;
  iVar1 = -1;
  if (optind < argc) {
    pcVar3 = argv[optind];
    sVar2 = strlen(pcVar3);
    if (((sVar2 < 3) || (*pcVar3 != '-')) || (pcVar3[1] != '-')) {
      iVar1 = getopt(argc,argv,optstring);
      return iVar1;
    }
    sVar2 = strcspn(pcVar3 + 2,"=");
    __s1 = longopts->name;
    iVar1 = 0x3f;
    if (__s1 != (char *)0x0) {
      iVar4 = 0;
      poVar8 = (option *)0x0;
      poVar6 = longopts;
      do {
        iVar1 = strncmp(__s1,pcVar3 + 2,sVar2);
        if (iVar1 == 0) {
          poVar8 = poVar6;
        }
        iVar4 = iVar4 + (uint)(iVar1 == 0);
        __s1 = poVar6[1].name;
        poVar6 = poVar6 + 1;
      } while (__s1 != (char *)0x0);
      iVar1 = 0x3f;
      if (iVar4 == 1) {
        if (longindex != (int *)0x0) {
          *longindex = (int)((ulong)((long)poVar8 - (long)longopts) >> 5);
        }
        iVar1 = poVar8->val;
        if (poVar8->flag != (int *)0x0) {
          *poVar8->flag = iVar1;
          iVar1 = 0;
        }
        iVar7 = optind;
        iVar4 = poVar8->has_arg;
        lVar5 = (long)optind;
        pcVar3 = strchr(argv[lVar5],0x3d);
        if (iVar4 == 0) {
          if (pcVar3 != (char *)0x0) {
            iVar1 = 0x3f;
          }
        }
        else {
          optarg = pcVar3 + 1;
          if (pcVar3 == (char *)0x0) {
            optarg = (char *)0x0;
          }
          if ((iVar4 == 1) && (pcVar3 == (char *)0x0)) {
            iVar7 = iVar7 + 1;
            if (iVar7 < argc) {
              optarg = argv[lVar5 + 1];
              if (optarg == (char *)0x0) {
                iVar1 = 0x3a;
              }
            }
            else {
              iVar1 = 0x3a;
            }
          }
        }
      }
    }
    optind = iVar7 + 1;
  }
  return iVar1;
}

Assistant:

int getopt_long(int argc, char* const argv[], const char* optstring,
  const struct option* longopts, int* longindex) {
  const struct option* o = longopts;
  const struct option* match = NULL;
  int num_matches = 0;
  size_t argument_name_length = 0;
  const char* current_argument = NULL;
  int retval = -1;

  optarg = NULL;
  optopt = 0;

  if (optind >= argc)
    return -1;

  if (strlen(argv[optind]) < 3 || strncmp(argv[optind], "--", 2) != 0)
    return getopt(argc, argv, optstring);

  /* It's an option; starts with -- and is longer than two chars. */
  current_argument = argv[optind] + 2;
  argument_name_length = strcspn(current_argument, "=");
  for (; o->name; ++o) {
    if (strncmp(o->name, current_argument, argument_name_length) == 0) {
      match = o;
      ++num_matches;
    }
  }

  if (num_matches == 1) {
    /* If longindex is not NULL, it points to a variable which is set to the
       index of the long option relative to longopts. */
    if (longindex)
      *longindex = (int) (match - longopts);

    /* If flag is NULL, then getopt_long() shall return val.
       Otherwise, getopt_long() returns 0, and flag shall point to a variable
       which shall be set to val if the option is found, but left unchanged if
       the option is not found. */
    if (match->flag)
      *(match->flag) = match->val;

    retval = match->flag ? 0 : match->val;

    if (match->has_arg != no_argument) {
      optarg = strchr(argv[optind], '=');
      if (optarg != NULL)
        ++optarg;

      if (match->has_arg == required_argument) {
        /* Only scan the next argv for required arguments. Behavior is not
           specified, but has been observed with Ubuntu and Mac OSX. */
        if (optarg == NULL && ++optind < argc) {
          optarg = argv[optind];
        }

        if (optarg == NULL)
          retval = ':';
      }
    } else if (strchr(argv[optind], '=')) {
      /* An argument was provided to a non-argument option.
         I haven't seen this specified explicitly, but both GNU and BSD-based
         implementations show this behavior.
      */
      retval = '?';
    }
  } else {
    /* Unknown option or ambiguous match. */
    retval = '?';
  }

  ++optind;
  return retval;
}